

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O2

bool __thiscall asl::HttpMessage::putFile(HttpMessage *this,String *path,int begin,int end)

{
  bool bVar1;
  char b;
  Long LVar2;
  undefined4 in_register_0000000c;
  size_t sVar3;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int iVar4;
  anon_union_16_2_78e7fdac_for_String_2 *paVar5;
  bool bVar6;
  uint local_144;
  String boundary;
  String head;
  String local_108;
  String local_f0;
  String local_d8;
  String local_c0;
  String local_a8;
  String local_90;
  File file;
  
  sVar3 = CONCAT44(in_register_0000000c,end);
  File::File(&file,path);
  bVar1 = File::exists(&file);
  if (bVar1) {
    local_144 = end;
    if (end == 0 && begin == 0) {
      String::String(&boundary,"Content-Range");
      bVar1 = hasHeader(this,&boundary);
      String::~String(&boundary);
      if (bVar1) goto LAB_00129acf;
      String::String(&boundary,"Content-Length");
      LVar2 = File::size(&file);
      String::String(&head,LVar2);
      setHeader(this,&boundary,&head);
    }
    else {
LAB_00129acf:
      LVar2 = File::size(&file);
      if (end == 0) {
        local_144 = (int)LVar2 - 1;
      }
      if ((begin < 0 || (local_144 - begin == 0 || (int)local_144 < begin)) ||
          LVar2 < (int)local_144) {
        String::String(&boundary,"Content-Length");
        String::String(&head,"0");
        setHeader(this,&boundary,&head);
        String::~String(&head);
        String::~String(&boundary);
        String::String(&boundary,"Content-Range");
        String::f(&head,"bytes */%lli",LVar2);
        setHeader(this,&boundary,&head);
        String::~String(&head);
        String::~String(&boundary);
        goto LAB_00129bea;
      }
      String::String(&boundary,"Content-Length");
      String::String(&head,(local_144 - begin) + 1);
      setHeader(this,&boundary,&head);
      String::~String(&head);
      String::~String(&boundary);
      String::String(&boundary,"Content-Range");
      String::f(&head,"bytes %i-%i/%lli",(ulong)(uint)begin,(ulong)local_144,LVar2);
      setHeader(this,&boundary,&head);
    }
    String::~String(&head);
    String::~String(&boundary);
    String::String(&head,"Content-Type");
    header(&boundary,this,&head);
    bVar1 = String::operator==(&boundary,"multipart/form-data");
    String::~String(&boundary);
    String::~String(&head);
    boundary.field_2._space[0] = '\0';
    boundary._size = 0;
    boundary._len = 0;
    if (bVar1) {
      String::operator=(&boundary,"-----------");
      iVar4 = 0x40;
      while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
        b = Random::operator()((Random *)random,'0','9');
        String::operator+=(&boundary,b);
      }
      operator+(&local_90,"--",&boundary);
      String::operator+(&local_d8,&local_90,"\r\n");
      String::operator+(&local_c0,&local_d8,
                        "Content-Disposition: form-data; name=\"files\"; filename=\"");
      File::name(&local_a8,&file);
      String::operator+(&local_f0,&local_c0,&local_a8);
      String::operator+(&local_108,&local_f0,"\"\r\n");
      String::operator+(&head,&local_108,"Content-Type: application/octet-stream\r\n\r\n");
      String::~String(&local_108);
      String::~String(&local_f0);
      String::~String(&local_a8);
      String::~String(&local_c0);
      String::~String(&local_d8);
      String::~String(&local_90);
      String::String(&local_108,"Content-Length");
      String::String(&local_d8,"Content-Length");
      header(&local_c0,this,&local_d8);
      iVar4 = String::operator_cast_to_int(&local_c0);
      sVar3 = (size_t)(uint)boundary._len;
      String::String(&local_f0,boundary._len + iVar4 + head._len + 8);
      setHeader(this,&local_108,&local_f0);
      String::~String(&local_f0);
      String::~String(&local_c0);
      String::~String(&local_d8);
      String::~String(&local_108);
      String::String(&local_108,"Content-Type");
      operator+(&local_f0,"multipart/form-data; boundary=",&boundary);
      setHeader(this,&local_108,&local_f0);
      String::~String(&local_f0);
      String::~String(&local_108);
      write(this,(int)&head,__buf_00,sVar3);
      String::~String(&head);
    }
    sVar3 = (size_t)local_144;
    writeFile(this,path,begin,local_144);
    if (bVar1) {
      operator+(&local_108,"\r\n--",&boundary);
      String::operator+(&head,&local_108,"--\r\n");
      write(this,(int)&head,__buf_01,sVar3);
      String::~String(&head);
      String::~String(&local_108);
    }
    String::~String(&boundary);
    bVar1 = true;
  }
  else {
    if (path->_size == 0) {
      paVar5 = &path->field_2;
    }
    else {
      paVar5 = (anon_union_16_2_78e7fdac_for_String_2 *)(path->field_2)._str;
    }
    printf("file to upload not found %s\n",paVar5);
    iVar4 = 0x142187;
    put(this,"");
    write(this,iVar4,__buf,sVar3);
LAB_00129bea:
    bVar1 = false;
  }
  File::~File(&file);
  return bVar1;
}

Assistant:

bool HttpMessage::putFile(const String& path, int begin, int end)
{
	File file(path);
	if (!file.exists())
	{
		printf("file to upload not found %s\n", *path);
		put("");
		write();
		return false;
	}
	if (begin == 0 && end == 0 && !hasHeader("Content-Range"))
		setHeader("Content-Length", file.size());
	else
	{
		Long size = file.size();
		if (end == 0)
			end = int(size - 1);
		if (end <= begin || begin < 0 || end > size)
		{
			setHeader("Content-Length", "0");
			setHeader("Content-Range", String::f("bytes */%lli", size));
			return false;
		}
		setHeader("Content-Length", end - begin + 1);
		setHeader("Content-Range", String::f("bytes %i-%i/%lli", begin, end, size));
	}

	bool multipart = header("Content-Type") == "multipart/form-data";

	String boundary;

	if (multipart)
	{
		boundary = "-----------";
		for (int i = 0; i < 64; i++)
			boundary += (char)random('0', '9');

		String head = "--" + boundary + "\r\n" +
			"Content-Disposition: form-data; name=\"files\"; filename=\"" + file.name() + "\"\r\n" +
			"Content-Type: application/octet-stream\r\n\r\n";

		setHeader("Content-Length", int(header("Content-Length")) + head.length() + boundary.length() + 8);
		setHeader("Content-Type", "multipart/form-data; boundary=" + boundary);

		write(head);
	}
	writeFile(path, begin, end);
	
	if (multipart)
	{
		write("\r\n--" + boundary + "--\r\n");
	}

	return true;
}